

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_ldo_env_A0(DisasContext *s,int offset)

{
  int iVar1;
  TCGContext *tcg_ctx;
  
  tcg_ctx = s->uc->tcg_ctx;
  iVar1 = s->mem_index;
  tcg_gen_qemu_ld_i64_x86_64(tcg_ctx,s->tmp1_i64,s->A0,(long)iVar1,MO_64);
  tcg_gen_op3_x86_64(tcg_ctx,INDEX_op_st_i64,(TCGArg)(s->tmp1_i64 + (long)tcg_ctx),
                     (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(uint)offset);
  tcg_gen_addi_i64_x86_64(tcg_ctx,s->tmp0,s->A0,8);
  tcg_gen_qemu_ld_i64_x86_64(tcg_ctx,s->tmp1_i64,s->tmp0,(long)iVar1,MO_64);
  tcg_gen_op3_x86_64(tcg_ctx,INDEX_op_st_i64,(TCGArg)(s->tmp1_i64 + (long)tcg_ctx),
                     (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(uint)offset + 8);
  return;
}

Assistant:

static inline void gen_ldo_env_A0(DisasContext *s, int offset)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int mem_index = s->mem_index;
    tcg_gen_qemu_ld_i64(tcg_ctx, s->tmp1_i64, s->A0, mem_index, MO_LEQ);
    tcg_gen_st_i64(tcg_ctx, s->tmp1_i64, tcg_ctx->cpu_env, offset + offsetof(ZMMReg, ZMM_Q(0)));
    tcg_gen_addi_tl(tcg_ctx, s->tmp0, s->A0, 8);
    tcg_gen_qemu_ld_i64(tcg_ctx, s->tmp1_i64, s->tmp0, mem_index, MO_LEQ);
    tcg_gen_st_i64(tcg_ctx, s->tmp1_i64, tcg_ctx->cpu_env, offset + offsetof(ZMMReg, ZMM_Q(1)));
}